

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O2

void __thiscall cmCommandArgumentParserHelper::CleanupParser(cmCommandArgumentParserHelper *this)

{
  const_iterator __last;
  char **ppcVar1;
  
  for (ppcVar1 = (this->Variables).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      __last._M_current =
           (this->Variables).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_finish, ppcVar1 != __last._M_current; ppcVar1 = ppcVar1 + 1) {
    if (*ppcVar1 != (char *)0x0) {
      operator_delete__(*ppcVar1);
    }
  }
  std::vector<char_*,_std::allocator<char_*>_>::erase
            (&this->Variables,
             (const_iterator)
             (this->Variables).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_start,__last);
  return;
}

Assistant:

void cmCommandArgumentParserHelper::CleanupParser()
{
  std::vector<char*>::iterator sit;
  for (sit = this->Variables.begin(); sit != this->Variables.end(); ++sit) {
    delete[] * sit;
  }
  this->Variables.erase(this->Variables.begin(), this->Variables.end());
}